

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

Type __thiscall capnp::SchemaLoader::getType(SchemaLoader *this,Reader proto,Schema scope)

{
  short sVar1;
  Reader proto_00;
  Reader brand;
  Reader brand_00;
  Reader brand_01;
  ulong uVar2;
  undefined8 uVar3;
  anon_union_8_2_eba6ea51_for_Type_5 aVar4;
  byte bVar5;
  uint index;
  ulong uVar6;
  uint64_t uVar7;
  ulong uVar8;
  Type TVar9;
  Type TVar10;
  Reader local_128;
  Schema local_f0;
  Schema local_e8;
  Reader local_e0;
  Reader local_b0;
  Reader local_80;
  Reader local_50;
  
  if (proto._reader.dataSize < 0x10) {
    uVar2 = 0;
switchD_001a6fd5_caseD_0:
LAB_001a6fd9:
    bVar5 = 0;
    uVar8 = 0;
    uVar6 = 0;
    TVar10.field_4.schema = (RawBrandedSchema *)0x0;
    TVar10.baseType = (short)uVar2;
    TVar10.listDepth = (char)(uVar2 >> 0x10);
    TVar10.isImplicitParam = (bool)(char)(uVar2 >> 0x18);
    TVar10.field_3 = (anon_union_2_2_d12d5221_for_Type_3)(short)(uVar2 >> 0x20);
    TVar10._6_2_ = (short)(uVar2 >> 0x30);
  }
  else {
    uVar2 = (ulong)*proto._reader.data;
    local_128._reader._32_8_ = proto._reader._32_8_;
    local_e8.raw = scope.raw;
    switch(uVar2) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
      goto switchD_001a6fd5_caseD_0;
    case 0xe:
      local_128._reader.nestingLimit = proto._reader.nestingLimit;
      local_128._reader._44_4_ = proto._reader._44_4_;
      local_128._reader.data = proto._reader.data;
      local_128._reader.pointers = proto._reader.pointers;
      local_128._reader.segment = proto._reader.segment;
      local_128._reader.capTable = proto._reader.capTable;
      capnp::schema::Type::List::Reader::getElementType(&local_e0,&local_128);
      proto_00._reader.capTable = local_e0._reader.capTable;
      proto_00._reader.segment = local_e0._reader.segment;
      proto_00._reader.data = local_e0._reader.data;
      proto_00._reader.pointers = local_e0._reader.pointers;
      proto_00._reader.dataSize = local_e0._reader.dataSize;
      proto_00._reader.pointerCount = local_e0._reader.pointerCount;
      proto_00._reader._38_2_ = local_e0._reader._38_2_;
      proto_00._reader.nestingLimit = local_e0._reader.nestingLimit;
      proto_00._reader._44_4_ = local_e0._reader._44_4_;
      TVar10 = getType(this,proto_00,scope);
      uVar6 = TVar10._0_8_;
      bVar5 = TVar10.listDepth + 1;
LAB_001a7142:
      uVar6 = uVar6 & 0xffff000000000000;
      uVar8 = TVar10._0_8_;
      goto LAB_001a6fdf;
    case 0xf:
      local_128._reader.nestingLimit = proto._reader.nestingLimit;
      local_128._reader._44_4_ = proto._reader._44_4_;
      local_128._reader.data = proto._reader.data;
      local_128._reader.pointers = proto._reader.pointers;
      local_128._reader.segment = proto._reader.segment;
      local_128._reader.capTable = proto._reader.capTable;
      if (proto._reader.dataSize < 0x80) {
        uVar7 = 0;
      }
      else {
        uVar7 = *(uint64_t *)((long)proto._reader.data + 8);
      }
      capnp::schema::Type::Enum::Reader::getBrand(&local_80,(Reader *)&local_128);
      brand._reader.capTable = local_80._reader.capTable;
      brand._reader.segment = local_80._reader.segment;
      brand._reader.data = local_80._reader.data;
      brand._reader.pointers = local_80._reader.pointers;
      brand._reader.dataSize = local_80._reader.dataSize;
      brand._reader.pointerCount = local_80._reader.pointerCount;
      brand._reader._38_2_ = local_80._reader._38_2_;
      brand._reader.nestingLimit = local_80._reader.nestingLimit;
      brand._reader._44_4_ = local_80._reader._44_4_;
      local_f0 = get(this,uVar7,brand,scope);
      aVar4 = (anon_union_8_2_eba6ea51_for_Type_5)Schema::asEnum(&local_f0);
      uVar3 = 0xf;
      break;
    case 0x10:
      local_128._reader.nestingLimit = proto._reader.nestingLimit;
      local_128._reader._44_4_ = proto._reader._44_4_;
      local_128._reader.data = proto._reader.data;
      local_128._reader.pointers = proto._reader.pointers;
      local_128._reader.segment = proto._reader.segment;
      local_128._reader.capTable = proto._reader.capTable;
      if (proto._reader.dataSize < 0x80) {
        uVar7 = 0;
      }
      else {
        uVar7 = *(uint64_t *)((long)proto._reader.data + 8);
      }
      capnp::schema::Type::Struct::Reader::getBrand(&local_50,(Reader *)&local_128);
      brand_01._reader.capTable = local_50._reader.capTable;
      brand_01._reader.segment = local_50._reader.segment;
      brand_01._reader.data = local_50._reader.data;
      brand_01._reader.pointers = local_50._reader.pointers;
      brand_01._reader.dataSize = local_50._reader.dataSize;
      brand_01._reader.pointerCount = local_50._reader.pointerCount;
      brand_01._reader._38_2_ = local_50._reader._38_2_;
      brand_01._reader.nestingLimit = local_50._reader.nestingLimit;
      brand_01._reader._44_4_ = local_50._reader._44_4_;
      local_f0 = get(this,uVar7,brand_01,scope);
      aVar4 = (anon_union_8_2_eba6ea51_for_Type_5)Schema::asStruct(&local_f0);
      uVar3 = 0x10;
      break;
    case 0x11:
      local_128._reader.nestingLimit = proto._reader.nestingLimit;
      local_128._reader._44_4_ = proto._reader._44_4_;
      local_128._reader.data = proto._reader.data;
      local_128._reader.pointers = proto._reader.pointers;
      local_128._reader.segment = proto._reader.segment;
      local_128._reader.capTable = proto._reader.capTable;
      if (proto._reader.dataSize < 0x80) {
        uVar7 = 0;
      }
      else {
        uVar7 = *(uint64_t *)((long)proto._reader.data + 8);
      }
      capnp::schema::Type::Interface::Reader::getBrand(&local_b0,(Reader *)&local_128);
      brand_00._reader.capTable = local_b0._reader.capTable;
      brand_00._reader.segment = local_b0._reader.segment;
      brand_00._reader.data = local_b0._reader.data;
      brand_00._reader.pointers = local_b0._reader.pointers;
      brand_00._reader.dataSize = local_b0._reader.dataSize;
      brand_00._reader.pointerCount = local_b0._reader.pointerCount;
      brand_00._reader._38_2_ = local_b0._reader._38_2_;
      brand_00._reader.nestingLimit = local_b0._reader.nestingLimit;
      brand_00._reader._44_4_ = local_b0._reader._44_4_;
      local_f0 = get(this,uVar7,brand_00,scope);
      aVar4 = (anon_union_8_2_eba6ea51_for_Type_5)Schema::asInterface(&local_f0);
      uVar3 = 0x11;
      break;
    case 0x12:
      uVar2 = 0x12;
      if (0x4f < proto._reader.dataSize) {
        sVar1 = *(short *)((long)proto._reader.data + 8);
        bVar5 = 0;
        if (sVar1 != 0) {
          uVar8 = 0;
          uVar6 = 0;
          TVar10 = (Type)ZEXT816(0x12);
          if (sVar1 == 2) goto LAB_001a6fdf;
          if (sVar1 != 1) goto switchD_001a6fd5_default;
          if (proto._reader.dataSize < 0xc0) {
            uVar7 = 0;
            index = 0;
            if (0x5f < proto._reader.dataSize) goto LAB_001a72ad;
          }
          else {
            uVar7 = *(uint64_t *)((long)proto._reader.data + 0x10);
LAB_001a72ad:
            index = (uint)*(ushort *)((long)proto._reader.data + 10);
          }
          TVar10 = Schema::getBrandBinding(&local_e8,uVar7,index);
          uVar6 = TVar10._0_8_;
          bVar5 = TVar10.listDepth;
          goto LAB_001a7142;
        }
      }
      goto LAB_001a6fd9;
    default:
switchD_001a6fd5_default:
      kj::_::unreachable();
    }
    TVar10.field_4.schema = aVar4.schema;
    TVar10.baseType = (short)uVar3;
    TVar10.listDepth = (char)((ulong)uVar3 >> 0x10);
    TVar10.isImplicitParam = (bool)(char)((ulong)uVar3 >> 0x18);
    TVar10.field_3 = (anon_union_2_2_d12d5221_for_Type_3)(short)((ulong)uVar3 >> 0x20);
    TVar10._6_2_ = (short)((ulong)uVar3 >> 0x30);
    bVar5 = 0;
    uVar8 = 0;
    uVar6 = 0;
  }
LAB_001a6fdf:
  TVar9.field_4 = TVar10.field_4;
  TVar9._0_8_ = TVar10._0_8_ & 0xffff | (ulong)((uint)uVar8 & 0xff000000) | (ulong)bVar5 << 0x10 |
                uVar8 & 0xffff00000000 | uVar6;
  return TVar9;
}

Assistant:

Type SchemaLoader::getType(schema::Type::Reader proto, Schema scope) const {
  switch (proto.which()) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::TEXT:
    case schema::Type::DATA:
      return proto.which();

    case schema::Type::STRUCT: {
      auto structType = proto.getStruct();
      return get(structType.getTypeId(), structType.getBrand(), scope).asStruct();
    }

    case schema::Type::ENUM: {
      auto enumType = proto.getEnum();
      return get(enumType.getTypeId(), enumType.getBrand(), scope).asEnum();
    }

    case schema::Type::INTERFACE: {
      auto interfaceType = proto.getInterface();
      return get(interfaceType.getTypeId(), interfaceType.getBrand(), scope)
          .asInterface();
    }

    case schema::Type::LIST:
      return ListSchema::of(getType(proto.getList().getElementType(), scope));

    case schema::Type::ANY_POINTER: {
      auto anyPointer = proto.getAnyPointer();
      switch (anyPointer.which()) {
        case schema::Type::AnyPointer::UNCONSTRAINED:
          return schema::Type::ANY_POINTER;
        case schema::Type::AnyPointer::PARAMETER: {
          auto param = anyPointer.getParameter();
          return scope.getBrandBinding(param.getScopeId(), param.getParameterIndex());
        }
        case schema::Type::AnyPointer::IMPLICIT_METHOD_PARAMETER:
          // We don't support binding implicit method params here.
          return schema::Type::ANY_POINTER;
      }

      KJ_UNREACHABLE;
    }
  }

  KJ_UNREACHABLE;
}